

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp.hpp
# Opt level: O0

void lcp_from_sa<unsigned_long>
               (string *S,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *ISA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP)

{
  char cVar1;
  value_type vVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  const_reference pvVar7;
  char *pcVar8;
  bool bVar9;
  value_type local_40;
  size_t k;
  size_t i;
  size_t h;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *ISA_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *SA_local;
  string *S_local;
  
  sVar3 = std::__cxx11::string::size();
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(SA);
  if (sVar3 != sVar4) {
    __assert_fail("S.size() == SA.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/lcp.hpp"
                  ,0x2f,
                  "void lcp_from_sa(const std::string &, const std::vector<index_t> &, const std::vector<index_t> &, std::vector<index_t> &) [index_t = unsigned long]"
                 );
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(SA);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(ISA);
  if (sVar3 != sVar4) {
    __assert_fail("SA.size() == ISA.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/lcp.hpp"
                  ,0x30,
                  "void lcp_from_sa(const std::string &, const std::vector<index_t> &, const std::vector<index_t> &, std::vector<index_t> &) [index_t = unsigned long]"
                 );
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(LCP);
  sVar4 = std::__cxx11::string::size();
  if (sVar3 != sVar4) {
    sVar3 = std::__cxx11::string::size();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(LCP,sVar3);
  }
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](LCP,0);
  *pvVar5 = 0;
  i = 0;
  for (k = 0; uVar6 = std::__cxx11::string::size(), k < uVar6; k = k + 1) {
    local_40 = 0;
    if (i != 0) {
      local_40 = i - 1;
    }
    while( true ) {
      uVar6 = std::__cxx11::string::size();
      bVar9 = false;
      if (k + local_40 < uVar6) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](ISA,k);
        bVar9 = false;
        if (*pvVar7 != 0) {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](ISA,k);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (SA,*pvVar7 - 1);
          vVar2 = *pvVar7;
          uVar6 = std::__cxx11::string::size();
          bVar9 = false;
          if (vVar2 + local_40 < uVar6) {
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)S);
            cVar1 = *pcVar8;
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](ISA,k);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](SA,*pvVar7 - 1);
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)S);
            bVar9 = cVar1 == *pcVar8;
          }
        }
      }
      if (!bVar9) break;
      local_40 = local_40 + 1;
    }
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](ISA,k);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](LCP,*pvVar7);
    *pvVar5 = local_40;
    i = local_40;
  }
  return;
}

Assistant:

void lcp_from_sa(const std::string& S, const std::vector<index_t>& SA, const std::vector<index_t>& ISA, std::vector<index_t>& LCP) {
    // TODO: cite the source for this linear O(n) algorithm!

    // input sizes must be equal
    assert(S.size() == SA.size());
    assert(SA.size() == ISA.size());

    // init LCP array if not yet of correct size
    if (LCP.size() != S.size()) {
        LCP.resize(S.size());
    }

    // first LCP is undefined -> set to 0:
    LCP[0] = 0;

    std::size_t h = 0;

    // in string order!
    for (std::size_t i = 0; i < S.size(); ++i) {
        // length of currently equal characters (in string order, next LCP value
        // is always >= current lcp - 1)
        std::size_t k = 0;
        if (h > 0)
            k = h-1;
        // comparing suffix starting from i=SA[ISA[i]] with the previous
        // suffix in SA order: SA[ISA[i]-1]
        while (i+k < S.size() && ISA[i] > 0 && SA[ISA[i]-1]+k < S.size() && S[i+k] == S[SA[ISA[i]-1]+k])
            k++;
        LCP[ISA[i]] = k;
        h = k;
    }
}